

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

void __thiscall Js::SourceTextModuleRecord::Finalize(SourceTextModuleRecord *this,bool isShutdown)

{
  Parser *this_00;
  ScriptContext *pSVar1;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  undefined7 in_register_00000031;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_30;
  
  (this->parseTree).ptr = (ParseNodeProg *)0x0;
  (this->parentModuleList).ptr =
       (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  (this->requestedModuleList).ptr = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  (this->importRecordList).ptr =
       (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
  (this->localExportRecordList).ptr =
       (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
  (this->indirectExportRecordList).ptr =
       (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
  (this->starExportRecordList).ptr =
       (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if ((int)CONCAT71(in_register_00000031,isShutdown) == 0) {
    this_00 = this->parser;
    if (this_00 != (Parser *)0x0) {
      pSVar1 = (this->scriptContext).ptr;
      Parser::~Parser(this_00);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&(pSVar1->generalAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,this_00,
                 0xaa8);
      this->parser = (Type)0x0;
    }
    pBVar2 = (this->childrenModuleSet).ptr;
    if (pBVar2 != (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)0x0) {
      pSVar1 = (this->scriptContext).ptr;
      Memory::Recycler::WBSetBit((char *)&local_30);
      local_30 = pBVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
      pBVar2 = local_30;
      JsUtil::
      BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary(local_30);
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                (&(pSVar1->generalAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,pBVar2,
                 0x38);
      (this->childrenModuleSet).ptr =
           (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)0x0;
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::Finalize(bool isShutdown)
    {
        parseTree = nullptr;
        requestedModuleList = nullptr;
        importRecordList = nullptr;
        localExportRecordList = nullptr;
        indirectExportRecordList = nullptr;
        starExportRecordList = nullptr;
        parentModuleList = nullptr;
        if (!isShutdown)
        {
            AdeleteUnlessNull(scriptContext->GeneralAllocator(), parser);
            AdeleteUnlessNull(scriptContext->GeneralAllocator(), childrenModuleSet);
        }
    }